

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_checkbox_flags_text(nk_context *ctx,char *text,int len,uint *flags,uint value)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int old_val;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x4f84,
                  "int nk_checkbox_flags_text(struct nk_context *, const char *, int, unsigned int *, unsigned int)"
                 );
  }
  if (text != (char *)0x0) {
    if (flags != (uint *)0x0) {
      uVar3 = *flags;
      uVar1 = nk_check_text(ctx,text,len,uVar3 & value);
      iVar2 = 0;
      if ((uVar3 & value) != uVar1) {
        if (uVar1 == 0) {
          uVar3 = ~value & *flags;
        }
        else {
          uVar3 = value | *flags;
        }
        *flags = uVar3;
        iVar2 = 1;
      }
      return iVar2;
    }
    __assert_fail("flags",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x4f86,
                  "int nk_checkbox_flags_text(struct nk_context *, const char *, int, unsigned int *, unsigned int)"
                 );
  }
  __assert_fail("text",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x4f85,
                "int nk_checkbox_flags_text(struct nk_context *, const char *, int, unsigned int *, unsigned int)"
               );
}

Assistant:

NK_API int
nk_checkbox_flags_text(struct nk_context *ctx, const char *text, int len,
    unsigned int *flags, unsigned int value)
{
    int active;
    NK_ASSERT(ctx);
    NK_ASSERT(text);
    NK_ASSERT(flags);
    if (!ctx || !text || !flags) return 0;

    active = (int)((*flags & value) & value);
    if (nk_checkbox_text(ctx, text, len, &active)) {
        if (active) *flags |= value;
        else *flags &= ~value;
        return 1;
    }
    return 0;
}